

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O2

UniquePtr<BIGNUM> GetBIGNUM(FileTest *t,char *key)

{
  bool bVar1;
  _Head_base<0UL,_FileTest::LineReader_*,_false> _Var2;
  char *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  allocator<char> local_59;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,in_RDX,&local_59);
  bVar1 = FileTest::GetBytes((FileTest *)key,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    _Var2._M_head_impl =
         (LineReader *)
         BN_bin2bn(local_58._M_impl.super__Vector_impl_data._M_start,
                   (int)local_58._M_impl.super__Vector_impl_data._M_finish -
                   (int)local_58._M_impl.super__Vector_impl_data._M_start,(BIGNUM *)0x0);
  }
  else {
    _Var2._M_head_impl = (LineReader *)0x0;
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = _Var2._M_head_impl;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

static bssl::UniquePtr<BIGNUM> GetBIGNUM(FileTest *t, const char *key) {
  std::vector<uint8_t> bytes;
  if (!t->GetBytes(&bytes, key)) {
    return nullptr;
  }

  return bssl::UniquePtr<BIGNUM>(BN_bin2bn(bytes.data(), bytes.size(), nullptr));
}